

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef BinaryenArrayLen(BinaryenModuleRef module,BinaryenExpressionRef ref)

{
  ArrayLen *pAVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pAVar1 = wasm::Builder::makeArrayLen(&local_10,ref);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenArrayLen(BinaryenModuleRef module,
                                       BinaryenExpressionRef ref) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeArrayLen((Expression*)ref));
}